

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O2

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceLine(EdgeTracer *this,PointF dEdge,RegressionLine *line)

{
  ByteMatrix *pBVar1;
  pointer pcVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  PointF PVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  PointT<double> pos;
  PointT<double> p;
  PointT<double> pos_00;
  PointT<double> pos_01;
  undefined1 local_78 [48];
  double local_48;
  double dStack_40;
  undefined1 auVar17 [16];
  
  dVar12 = dEdge.y;
  dVar15 = dEdge.x;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar15;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar12;
  auVar16._0_8_ = SQRT(dVar15 * dVar15 + dVar12 * dVar12);
  auVar16._8_8_ = auVar16._0_8_;
  PVar20 = (PointF)divpd((undefined1  [16])dEdge,auVar16);
  line->_directionInward = PVar20;
  uVar5 = (uint)(ABS(dVar12) < ABS(dVar15));
  auVar13._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar13._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar13._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar13._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar14 = ~auVar13 & auVar14 << 0x40 | auVar19 & auVar13;
LAB_00167890:
  PVar20.x = (this->super_BitMatrixCursorF).p.x;
  PVar20.y = (this->super_BitMatrixCursorF).p.y;
  RegressionLine::add(line,PVar20);
  if (((int)((ulong)((long)(line->_points).
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(line->_points).
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) % 0x32) != 10) ||
     (bVar4 = updateDirectionFromLineCentroid(this,line), bVar4)) {
    iVar10 = 3;
    for (iVar7 = 1; iVar7 != 3; iVar7 = iVar7 + 1) {
      for (iVar11 = 1; iVar11 != 2; iVar11 = iVar11 + 1) {
        uVar6 = 0;
        while (iVar10 != (int)uVar6) {
          uVar9 = (int)uVar6 + 1;
          uVar5 = -(int)(uVar6 >> 1);
          if ((uVar6 & 1) != 0) {
            uVar5 = uVar9 >> 1;
          }
          local_48 = auVar14._0_8_;
          dStack_40 = auVar14._8_8_;
          auVar22._0_8_ =
               (double)(int)uVar5 * local_48 +
               (this->super_BitMatrixCursorF).d.x * (double)iVar11 +
               (this->super_BitMatrixCursorF).p.x;
          auVar22._8_8_ =
               (double)(int)uVar5 * dStack_40 +
               (this->super_BitMatrixCursorF).d.y * (double)iVar11 +
               (this->super_BitMatrixCursorF).p.y;
          pos.x = local_48 + auVar22._0_8_;
          dVar15 = dStack_40 + auVar22._8_8_;
          pos.y = dVar15;
          auVar17._8_8_ = dVar15;
          auVar17._0_8_ = (ulong)dVar15;
          bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                            (&this->super_BitMatrixCursorF,pos);
          uVar6 = (ulong)uVar9;
          iVar8 = 3;
          if (bVar4) goto LAB_00167983;
        }
      }
      iVar10 = iVar10 + 2;
    }
    if (0x10 < (ulong)((long)(line->_points).
                             super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(line->_points).
                            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      bVar4 = updateDirectionFromLineCentroid(this,line);
      return bVar4;
    }
  }
  return false;
LAB_00167983:
  while( true ) {
    if (iVar8 == 0) {
      return false;
    }
    auVar3._4_8_ = auVar17._8_8_;
    auVar3._0_4_ = auVar22._4_4_;
    auVar18._0_8_ = auVar3._0_8_ << 0x20;
    auVar18._8_4_ = auVar22._8_4_;
    auVar18._12_4_ = auVar22._12_4_;
    dVar15 = auVar18._8_8_;
    local_78._0_8_ = auVar22._0_8_;
    p.y = dVar15;
    p.x = (double)local_78._0_8_;
    bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(&this->super_BitMatrixCursorF,p);
    if (!bVar4) {
      return false;
    }
    pos_00.y = dVar15;
    pos_00.x = (double)local_78._0_8_;
    bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::whiteAt(&this->super_BitMatrixCursorF,pos_00);
    if (bVar4) break;
    local_78._0_8_ = (double)local_78._0_8_ - local_48;
    local_78._8_8_ = auVar22._8_8_ - dStack_40;
    pos_01.x = (double)local_78._0_8_ - (this->super_BitMatrixCursorF).d.x;
    pos_01.y = (double)local_78._8_8_ - (this->super_BitMatrixCursorF).d.y;
    bVar4 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&this->super_BitMatrixCursorF,pos_01);
    uVar5 = (uint)bVar4;
    auVar17._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
    auVar17._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar17._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
    auVar21._0_8_ =
         (ulong)((double)local_78._0_8_ - (this->super_BitMatrixCursorF).d.x) & auVar17._0_8_;
    auVar21._8_8_ =
         (ulong)((double)local_78._8_8_ - (this->super_BitMatrixCursorF).d.y) & auVar17._8_8_;
    auVar22 = auVar21 | ~auVar17 & local_78._0_16_;
    iVar8 = iVar8 + -1;
  }
  dVar12 = floor((double)local_78._0_8_);
  dVar15 = floor(dVar15);
  (this->super_BitMatrixCursorF).p.x = dVar12 + 0.5;
  (this->super_BitMatrixCursorF).p.y = dVar15 + 0.5;
  pBVar1 = this->history;
  if (pBVar1 != (ByteMatrix *)0x0) {
    iVar7 = (int)(dVar15 + 0.5) * (pBVar1->super_Matrix<signed_char>)._width + (int)(dVar12 + 0.5);
    pcVar2 = (pBVar1->super_Matrix<signed_char>)._data.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->state == (int)pcVar2[iVar7]) {
      return false;
    }
    pcVar2[iVar7] = (char)this->state;
  }
  goto LAB_00167890;
}

Assistant:

bool traceLine(PointF dEdge, RegressionLine& line)
	{
		line.setDirectionInward(dEdge);
		do {
			log(p);
			line.add(p);
			if (line.points().size() % 50 == 10 && !updateDirectionFromLineCentroid(line))
				return false;
			auto stepResult = traceStep(dEdge, 1, line.isValid());
			if (stepResult != StepResult::FOUND)
				return stepResult == StepResult::OPEN_END && line.points().size() > 1 && updateDirectionFromLineCentroid(line);
		} while (true);
	}